

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_bytedata.h
# Opt level: O1

ByteData * __thiscall
cfd::core::ByteData256::Join<cfd::core::ByteData,cfd::core::ByteData160,cfd::core::ByteData256>
          (ByteData *__return_storage_ptr__,ByteData256 *this,ByteData *top,ByteData160 *args,
          ByteData256 *args_1)

{
  ByteData result;
  ByteData local_38;
  
  Join<cfd::core::ByteData>(&local_38,this,top);
  ByteData::Join<cfd::core::ByteData160,cfd::core::ByteData256>
            (__return_storage_ptr__,&local_38,args,args_1);
  if (local_38.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

ByteData Join(const ByteTop& top, const ByteDataClass&... args) const {
    ByteData result = Join(top);
    return result.Join(args...);
  }